

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

wchar_t archive_entry_update_hardlink_utf8(archive_entry *entry,char *target)

{
  wchar_t wVar1;
  int *piVar2;
  long in_RSI;
  long in_RDI;
  char *in_stack_00000028;
  archive_mstring *in_stack_00000030;
  archive *in_stack_00000038;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RSI == 0) {
    *(uint *)(in_RDI + 0xc0) = *(uint *)(in_RDI + 0xc0) & 0xfffffffe;
  }
  else {
    *(uint *)(in_RDI + 0xc0) = *(uint *)(in_RDI + 0xc0) | 1;
  }
  wVar1 = archive_mstring_update_utf8(in_stack_00000038,in_stack_00000030,in_stack_00000028);
  if (wVar1 == L'\0') {
    wVar1 = L'\x01';
  }
  else {
    piVar2 = __errno_location();
    if (*piVar2 == 0xc) {
      __archive_errx(target._4_4_,
                     (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    }
    wVar1 = L'\0';
  }
  return wVar1;
}

Assistant:

int
archive_entry_update_hardlink_utf8(struct archive_entry *entry, const char *target)
{
	if (target != NULL)
		entry->ae_set |= AE_SET_HARDLINK;
	else
		entry->ae_set &= ~AE_SET_HARDLINK;
	if (archive_mstring_update_utf8(entry->archive,
	    &entry->ae_hardlink, target) == 0)
		return (1);
	if (errno == ENOMEM)
		__archive_errx(1, "No memory");
	return (0);
}